

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::OclLib::getString(cl_program program,cl_program_info param_name)

{
  char *in_RDI;
  String SVar1;
  uint in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  SVar1 = getOclString<int(*)(_cl_program*,unsigned_int,unsigned_long,void*,unsigned_long*),_cl_program*,unsigned_int>
                    ((_func_int__cl_program_ptr_uint_unsigned_long_void_ptr_unsigned_long_ptr *)
                     program,(_cl_program *)CONCAT44(param_name,in_stack_00000010),in_stack_0000000c
                    );
  SVar1.m_data = in_RDI;
  return SVar1;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_program program, cl_program_info param_name) noexcept
{
    return getOclString(OclLib::getProgramInfo, program, param_name);
}